

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fthash.c
# Opt level: O0

void ft_hash_str_free(FT_Hash hash,FT_Memory memory)

{
  uint uVar1;
  uint local_2c;
  FT_Hashnode *ppFStack_28;
  FT_UInt i;
  FT_Hashnode *bp;
  FT_UInt sz;
  FT_Memory memory_local;
  FT_Hash hash_local;
  
  if (hash != (FT_Hash)0x0) {
    uVar1 = hash->size;
    ppFStack_28 = hash->table;
    for (local_2c = 0; local_2c < uVar1; local_2c = local_2c + 1) {
      ft_mem_free(memory,*ppFStack_28);
      *ppFStack_28 = (FT_Hashnode)0x0;
      ppFStack_28 = ppFStack_28 + 1;
    }
    ft_mem_free(memory,hash->table);
    hash->table = (FT_Hashnode *)0x0;
  }
  return;
}

Assistant:

void
  ft_hash_str_free( FT_Hash    hash,
                    FT_Memory  memory )
  {
    if ( hash )
    {
      FT_UInt       sz = hash->size;
      FT_Hashnode*  bp = hash->table;
      FT_UInt       i;


      for ( i = 0; i < sz; i++, bp++ )
        FT_FREE( *bp );

      FT_FREE( hash->table );
    }
  }